

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O0

void amrex::single_level_weighted_redistribute
               (MultiFab *div_tmp_in,MultiFab *div_out,MultiFab *weights,int div_comp,int ncomp,
               Geometry *geom)

{
  bool bVar1;
  FabType FVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  long lVar4;
  undefined8 unaff_RBX;
  FabArrayBase *in_RDI;
  undefined4 in_R8D;
  Geometry *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  MultiFab *in_stack_00000008;
  int in_stack_00000034;
  MFIter *in_stack_00000038;
  MultiFab *in_stack_00000040;
  MultiFab *in_stack_00000048;
  MultiFab *in_stack_00000050;
  Box *in_stack_00000058;
  Box result_1;
  Box result;
  EBCellFlagFab *flags;
  EBFArrayBox *div_fab;
  Box *bx;
  MFIter mfi;
  MultiFab *volfrac;
  EBFArrayBoxFactory *ebfactory;
  int nghost;
  Real covered_val;
  Box domain;
  MultiFab *in_stack_000001c0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe00;
  Periodicity *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined1 uVar5;
  FabArrayBase *in_stack_fffffffffffffe18;
  Geometry *in_stack_fffffffffffffe20;
  Box local_18c;
  Box local_170;
  FabArray<amrex::FArrayBox> *local_148;
  EBFArrayBox *local_140;
  int local_134 [7];
  int *local_118;
  Box *in_stack_ffffffffffffff10;
  EBCellFlagFab *in_stack_ffffffffffffff18;
  Real in_stack_fffffffffffffff0;
  int ngrow;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
  ngrow = (int)((ulong)unaff_RBX >> 0x20);
  Geometry::Domain(in_R9);
  FabArrayBase::nGrow(in_RDI,0);
  EB_set_covered(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,ngrow,in_stack_fffffffffffffff0);
  Geometry::periodicity(in_stack_fffffffffffffe20);
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,(bool)uVar5);
  MultiFab::Copy((MultiFab *)in_stack_fffffffffffffe20,(MultiFab *)in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08);
  uVar5 = (undefined1)((uint)in_stack_fffffffffffffe14 >> 0x18);
  pFVar3 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x142ba4a);
  lVar4 = __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar4 != 0) {
    EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffdf0);
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(bool)uVar5);
    while (bVar1 = MFIter::isValid((MFIter *)&stack0xfffffffffffffef0), bVar1) {
      MFIter::tilebox((MFIter *)in_RDI);
      local_118 = local_134;
      local_140 = (EBFArrayBox *)
                  FabArray<amrex::FArrayBox>::operator[]
                            (in_stack_fffffffffffffdf0,
                             (MFIter *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                            );
      local_148 = (FabArray<amrex::FArrayBox> *)EBFArrayBox::getEBCellFlagFab(local_140);
      local_170.smallend.vect._0_8_ = *(undefined8 *)local_118;
      local_170.smallend.vect[2] = local_118[2];
      local_170.bigend.vect[0] = local_118[3];
      local_170.bigend.vect._4_8_ = *(undefined8 *)(local_118 + 4);
      local_170.btype.itype = local_118[6];
      Box::grow(&local_170,0);
      FVar2 = EBCellFlagFab::getType(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      bVar1 = false;
      if (FVar2 != covered) {
        local_18c.smallend.vect._0_8_ = *(undefined8 *)local_118;
        local_18c.smallend.vect[2] = local_118[2];
        local_18c.bigend.vect[0] = local_118[3];
        local_18c.bigend.vect._4_8_ = *(undefined8 *)(local_118 + 4);
        local_18c.btype.itype = local_118[6];
        Box::grow(&local_18c,2);
        FVar2 = EBCellFlagFab::getType(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        bVar1 = FVar2 != regular;
      }
      if (bVar1) {
        in_stack_fffffffffffffde8 = in_R8D;
        in_stack_fffffffffffffdf0 = local_148;
        apply_eb_redistribution
                  (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                   in_stack_00000038,in_stack_00000034,domain.bigend.vect[1],stack0x000001b8,
                   in_stack_000001c0,(Box *)geom,(Geometry *)CONCAT44(div_comp,ncomp));
      }
      MFIter::operator++((MFIter *)&stack0xfffffffffffffef0);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffdf0);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void single_level_weighted_redistribute (MultiFab& div_tmp_in, MultiFab& div_out, const MultiFab& weights,
                                             int div_comp, int ncomp, const Geometry& geom)
    {
        Box domain(geom.Domain());

        Real covered_val = 1.e40;

        int nghost = 2;
        AMREX_ASSERT(div_tmp_in.nGrow() >= nghost);

        EB_set_covered(div_tmp_in, 0, ncomp, div_tmp_in.nGrow(), covered_val);

        div_tmp_in.FillBoundary(geom.periodicity());

        // Here we take care of both the regular and covered cases ... all we do below is the cut cell cases
        MultiFab::Copy(div_out, div_tmp_in, 0, div_comp, ncomp, 0);

        // Get EB geometric info
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(div_out.Factory());
        const MultiFab* volfrac   = &(ebfactory. getVolFrac());

        for (MFIter mfi(div_out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            // Tilebox
            const Box& bx = mfi.tilebox ();

            // this is to check efficiently if this tile contains any eb stuff
            const EBFArrayBox&  div_fab = static_cast<EBFArrayBox const&>(div_out[mfi]);
            const EBCellFlagFab&  flags = div_fab.getEBCellFlagFab();

            if ( !(flags.getType(amrex::grow(bx,     0)) == FabType::covered) &&
                 !(flags.getType(amrex::grow(bx,nghost)) == FabType::regular) )
            {
                // Compute div(tau) with EB algorithm
                apply_eb_redistribution(bx, div_out, div_tmp_in, weights, &mfi,
                                               div_comp, ncomp, flags, volfrac, domain,
                                               geom);

            }
        }
    }